

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_extract_fun3d_mapbc(REF_GEOM ref_geom,char *mapbc,REF_BOOL axi)

{
  REF_STATUS RVar1;
  uint uVar2;
  size_t sVar3;
  char *__dest;
  ulong uStack_80;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_SIZE i_1;
  REF_SIZE len_1;
  char *bc_name_1;
  char *attribute_1;
  REF_INT edge_id;
  REF_STATUS ref_private_macro_code_rss;
  REF_SIZE i;
  REF_SIZE len;
  char *bc_name;
  char *attribute;
  FILE *pFStack_30;
  REF_INT face_id;
  FILE *file;
  char *pcStack_20;
  REF_BOOL axi_local;
  char *mapbc_local;
  REF_GEOM ref_geom_local;
  
  file._4_4_ = axi;
  pcStack_20 = mapbc;
  mapbc_local = (char *)ref_geom;
  pFStack_30 = fopen(mapbc,"w");
  if (pFStack_30 == (FILE *)0x0) {
    printf("unable to open %s\n",pcStack_20);
  }
  if (pFStack_30 == (FILE *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0x1158,
           "ref_egads_extract_fun3d_mapbc","unable to open file");
    ref_geom_local._4_4_ = 2;
  }
  else {
    if (*(int *)(mapbc_local + 0x80) == 0) {
      bc_name_1 = (char *)0x0;
      for (attribute_1._0_4_ = 1; (int)(uint)attribute_1 <= *(int *)(mapbc_local + 0x6c);
          attribute_1._0_4_ = (uint)attribute_1 + 1) {
        RVar1 = ref_egads_get_attribute
                          ((REF_GEOM)mapbc_local,1,(uint)attribute_1,"bc_name",&bc_name_1);
        if (RVar1 != 0) {
          printf("bc_name not set for edge %d\n",(ulong)(uint)attribute_1);
          return 5;
        }
      }
      fprintf(pFStack_30,"%d\n",(ulong)(*(int *)(mapbc_local + 0x6c) + 2));
      for (attribute_1._0_4_ = 1; (int)(uint)attribute_1 <= *(int *)(mapbc_local + 0x6c);
          attribute_1._0_4_ = (uint)attribute_1 + 1) {
        uVar2 = ref_egads_get_attribute
                          ((REF_GEOM)mapbc_local,1,(uint)attribute_1,"bc_name",&bc_name_1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x118b,"ref_egads_extract_fun3d_mapbc",(ulong)uVar2,"get");
          return uVar2;
        }
        if (bc_name_1 == (char *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x118c,"ref_egads_extract_fun3d_mapbc","attribute NULL");
          return 2;
        }
        sVar3 = strlen(bc_name_1);
        if (9999 < sVar3) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x118e,"ref_egads_extract_fun3d_mapbc","attribute more than 10000 bytes");
          return 1;
        }
        if ((long)(sVar3 + 1) < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x118f,"ref_egads_extract_fun3d_mapbc","malloc bc_name of char negative");
          return 1;
        }
        __dest = (char *)malloc(sVar3 + 1);
        if (__dest == (char *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x118f,"ref_egads_extract_fun3d_mapbc","malloc bc_name of char NULL");
          return 2;
        }
        strcpy(__dest,bc_name_1);
        for (uStack_80 = 0; uStack_80 < sVar3; uStack_80 = uStack_80 + 1) {
          if (__dest[uStack_80] == '_') {
            __dest[uStack_80] = ' ';
            break;
          }
        }
        fprintf(pFStack_30,"%d %s\n",(ulong)(uint)attribute_1,__dest);
        if (__dest != (char *)0x0) {
          free(__dest);
        }
      }
      attribute_1._0_4_ = *(int *)(mapbc_local + 0x6c) + 1;
      fprintf(pFStack_30,"%d %s\n",(ulong)(uint)attribute_1,"6662 symmetry-y-min");
      attribute_1._0_4_ = *(int *)(mapbc_local + 0x6c) + 2;
      if (file._4_4_ == 0) {
        fprintf(pFStack_30,"%d %s\n",(ulong)(uint)attribute_1,"6662 symmetry-y-max");
      }
      else {
        fprintf(pFStack_30,"%d %s\n",(ulong)(uint)attribute_1,"6022 symmetry-y-max-axi");
      }
    }
    else {
      bc_name = (char *)0x0;
      for (attribute._4_4_ = 1; (int)attribute._4_4_ <= *(int *)(mapbc_local + 0x70);
          attribute._4_4_ = attribute._4_4_ + 1) {
        RVar1 = ref_egads_get_attribute((REF_GEOM)mapbc_local,2,attribute._4_4_,"bc_name",&bc_name);
        if (RVar1 != 0) {
          printf("bc_name not set for face %d\n",(ulong)attribute._4_4_);
          return 5;
        }
      }
      fprintf(pFStack_30,"%d\n",(ulong)*(uint *)(mapbc_local + 0x70));
      for (attribute._4_4_ = 1; (int)attribute._4_4_ <= *(int *)(mapbc_local + 0x70);
          attribute._4_4_ = attribute._4_4_ + 1) {
        attribute_1._4_4_ =
             ref_egads_get_attribute((REF_GEOM)mapbc_local,2,attribute._4_4_,"bc_name",&bc_name);
        if (attribute_1._4_4_ != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x116b,"ref_egads_extract_fun3d_mapbc",(ulong)attribute_1._4_4_,"get");
          return attribute_1._4_4_;
        }
        if (bc_name == (char *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x116c,"ref_egads_extract_fun3d_mapbc","attribute NULL");
          return 2;
        }
        i = strlen(bc_name);
        if (9999 < i) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x116e,"ref_egads_extract_fun3d_mapbc","attribute more than 10000 bytes");
          return 1;
        }
        if ((long)(i + 1) < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x116f,"ref_egads_extract_fun3d_mapbc","malloc bc_name of char negative");
          return 1;
        }
        len = (REF_SIZE)malloc(i + 1);
        if ((char *)len == (char *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",
                 0x116f,"ref_egads_extract_fun3d_mapbc","malloc bc_name of char NULL");
          return 2;
        }
        strcpy((char *)len,bc_name);
        for (_edge_id = 0; _edge_id < i; _edge_id = _edge_id + 1) {
          if (*(char *)(len + _edge_id) == '_') {
            *(undefined1 *)(len + _edge_id) = 0x20;
            break;
          }
        }
        fprintf(pFStack_30,"%d %s\n",(ulong)attribute._4_4_,len);
        if (len != 0) {
          free((void *)len);
        }
      }
    }
    fclose(pFStack_30);
    ref_geom_local._4_4_ = 0;
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_egads_extract_fun3d_mapbc(REF_GEOM ref_geom,
                                                 const char *mapbc,
                                                 REF_BOOL axi) {
  FILE *file;
  file = fopen(mapbc, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", mapbc);
  RNS(file, "unable to open file");

  if (ref_geom->manifold) {
    REF_INT face_id;
    const char *attribute = NULL;
    for (face_id = 1; face_id <= ref_geom->nface; face_id++) {
      if (REF_SUCCESS != ref_egads_get_attribute(ref_geom, REF_GEOM_FACE,
                                                 face_id, "bc_name",
                                                 &attribute)) {
        printf("bc_name not set for face %d\n", face_id);
        return REF_NOT_FOUND;
      }
    }
    fprintf(file, "%d\n", ref_geom->nface);
    for (face_id = 1; face_id <= ref_geom->nface; face_id++) {
      char *bc_name;
      REF_SIZE len, i;
      RSS(ref_egads_get_attribute(ref_geom, REF_GEOM_FACE, face_id, "bc_name",
                                  &attribute),
          "get");
      RNS(attribute, "attribute NULL");
      len = strlen(attribute);
      RAS(10000 > len, "attribute more than 10000 bytes");
      ref_malloc(bc_name, (REF_LONG)(len + 1), char);
      strcpy(bc_name, attribute);
      for (i = 0; i < len; i++) {
        if ('_' == bc_name[i]) {
          bc_name[i] = ' ';
          break;
        }
      }
      fprintf(file, "%d %s\n", face_id, bc_name);
      ref_free(bc_name);
    }
  } else {
    REF_INT edge_id;
    const char *attribute = NULL;
    for (edge_id = 1; edge_id <= ref_geom->nedge; edge_id++) {
      if (REF_SUCCESS != ref_egads_get_attribute(ref_geom, REF_GEOM_EDGE,
                                                 edge_id, "bc_name",
                                                 &attribute)) {
        printf("bc_name not set for edge %d\n", edge_id);
        return REF_NOT_FOUND;
      }
    }
    fprintf(file, "%d\n", 2 + ref_geom->nedge);
    for (edge_id = 1; edge_id <= ref_geom->nedge; edge_id++) {
      char *bc_name;
      REF_SIZE len, i;
      RSS(ref_egads_get_attribute(ref_geom, REF_GEOM_EDGE, edge_id, "bc_name",
                                  &attribute),
          "get");
      RNS(attribute, "attribute NULL");
      len = strlen(attribute);
      RAS(10000 > len, "attribute more than 10000 bytes");
      ref_malloc(bc_name, (REF_LONG)(len + 1), char);
      strcpy(bc_name, attribute);
      for (i = 0; i < len; i++) {
        if ('_' == bc_name[i]) {
          bc_name[i] = ' ';
          break;
        }
      }
      fprintf(file, "%d %s\n", edge_id, bc_name);
      ref_free(bc_name);
    }
    edge_id = ref_geom->nedge + 1;
    fprintf(file, "%d %s\n", edge_id, "6662 symmetry-y-min");
    edge_id = ref_geom->nedge + 2;
    if (axi) {
      fprintf(file, "%d %s\n", edge_id, "6022 symmetry-y-max-axi");
    } else {
      fprintf(file, "%d %s\n", edge_id, "6662 symmetry-y-max");
    }
  }
  fclose(file);

  return REF_SUCCESS;
}